

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O2

void ec_sync(int64 reftime,int64 cycletime,int64 *offsettime)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (reftime + -50000) % cycletime;
  lVar2 = 0;
  if (cycletime / 2 < lVar1) {
    lVar2 = cycletime;
  }
  lVar3 = lVar1 - lVar2;
  if (lVar3 == 0 || lVar1 < lVar2) {
    if (lVar3 < 0) {
      integral = integral + -1;
    }
  }
  else {
    integral = integral + 1;
  }
  *offsettime = integral / -0x14 + lVar3 / -100;
  return;
}

Assistant:

void ec_sync(int64 reftime, int64 cycletime , int64 *offsettime)
{
   int64 delta;
   /* set linux sync point 50us later than DC sync, just as example */
   delta = (reftime - 50000) % cycletime;
   if(delta> (cycletime /2)) { delta= delta - cycletime; }
   if(delta>0){ integral++; }
   if(delta<0){ integral--; }
   *offsettime = -(delta / 100) - (integral /20);
}